

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cpp
# Opt level: O3

void __thiscall
trun::SubProcess::Start(SubProcess *this,Ref *library,Ref *useModule,string *ipcName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 local_68;
  long *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40;
  long local_38;
  long local_30 [3];
  
  peVar2 = (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(element_type **)(this + 0x58) = peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60) = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  uVar4 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)(this + 0x68) = uVar4;
  *(undefined4 *)(*(long *)(this + 0x58) + 8) = 1;
  uStack_50 = (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  pcVar1 = (ipcName->_M_dataplus)._M_p;
  local_58 = this;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + ipcName->_M_string_length);
  local_68 = 0;
  local_60 = (long *)operator_new(0x40);
  *local_60 = (long)&PTR___State_impl_0021ecf0;
  *(undefined4 *)(local_60 + 1) = (undefined4)local_58;
  *(undefined4 *)((long)local_60 + 0xc) = local_58._4_4_;
  *(undefined4 *)(local_60 + 2) = (undefined4)uStack_50;
  *(undefined4 *)((long)local_60 + 0x14) = uStack_50._4_4_;
  local_60[3] = (long)local_48;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  local_60[4] = (long)(local_60 + 6);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_60 + 4),local_40,local_38 + (long)local_40);
  std::thread::_M_start_thread(&local_68,&local_60,0);
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  if (*(long *)(this + 0x50) == 0) {
    *(undefined8 *)(this + 0x50) = local_68;
    local_68 = 0;
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    return;
  }
  std::terminate();
}

Assistant:

void SubProcess::Start(const IDynLibrary::Ref &library, TestModule::Ref useModule, const std::string &ipcName) {
    // Save this locally, we need to update the state
    module = std::move(useModule);

    // Need to do this before spinning up the thread...
    tStart = pclock::now();

    module->ChangeState(TestModule::kState::Executing);

    // Note: CAN'T USE REFERENCES - they will change before capture actually takes place..
    thread = std::thread([this, library, ipcName]() {
        state = SubProcessState::kRunning;

        //
        // TO-DO
        //  - Forward certain config settings (like; -G/-D/-r/-c/-C
        //
        std::string optionals = {};
        if (!Config::Instance().testGlobalMain) optionals += "G";
        if (!Config::Instance().linuxUseDeepBinding) optionals += "D";
        if (!Config::Instance().skipOnModuleFail) optionals += "c";
        if (!Config::Instance().stopOnAllFail) optionals += "C";

        proc = new Process(Config::Instance().appName);
        proc->SetCallback(&dataHandler);
        name = module->name;
        if(!optionals.empty()) {
            optionals = "-" + optionals;
            proc->AddArgument(optionals);
        }

        proc->AddArgument("--sequential");  // otherwise we would fork ourselves
        proc->AddArgument("--subprocess");  // hidden; telling trun it's running as a sub-process
        proc->AddArgument("--ipc-name");    // hidden; telling trun which IPC FIFO file name it should use
        proc->AddArgument(ipcName);
        proc->AddArgument("-m");            // Append the module
        proc->AddArgument(module->name);
        proc->AddArgument(library->Name());
        wasProcessExecOk = proc->ExecuteAndWait();
        state = SubProcessState::kFinished;
        exitStatus = proc->GetExitStatus();
    });

}